

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O2

int av1_compute_rd_mult(int qindex,aom_bit_depth_t bit_depth,FRAME_UPDATE_TYPE update_type,
                       int layer_depth,int boost_index,FRAME_TYPE frame_type,
                       int use_fixed_qp_offsets,int is_stat_consumption_stage,aom_tune_metric tuning
                       )

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined3 in_register_00000089;
  
  iVar1 = av1_compute_rd_mult_based_on_qindex(bit_depth,update_type,qindex,tuning);
  lVar2 = (long)iVar1;
  if (((CONCAT31(in_register_00000089,frame_type) != 0) && (use_fixed_qp_offsets == 0)) &&
     (is_stat_consumption_stage != 0)) {
    lVar2 = rd_layer_depth_factor[layer_depth] * lVar2 >> 7;
    lVar2 = (rd_boost_factor[boost_index] * lVar2 >> 7) + lVar2;
  }
  lVar3 = 0x7fffffff;
  if (lVar2 < 0x7fffffff) {
    lVar3 = lVar2;
  }
  iVar1 = 1;
  if (0 < lVar2) {
    iVar1 = (int)lVar3;
  }
  return iVar1;
}

Assistant:

int av1_compute_rd_mult(const int qindex, const aom_bit_depth_t bit_depth,
                        const FRAME_UPDATE_TYPE update_type,
                        const int layer_depth, const int boost_index,
                        const FRAME_TYPE frame_type,
                        const int use_fixed_qp_offsets,
                        const int is_stat_consumption_stage,
                        const aom_tune_metric tuning) {
  int64_t rdmult = av1_compute_rd_mult_based_on_qindex(bit_depth, update_type,
                                                       qindex, tuning);
  if (is_stat_consumption_stage && !use_fixed_qp_offsets &&
      (frame_type != KEY_FRAME)) {
    // Layer depth adjustment
    rdmult = (rdmult * rd_layer_depth_factor[layer_depth]) >> 7;
    // ARF boost adjustment
    rdmult += ((rdmult * rd_boost_factor[boost_index]) >> 7);
  }
  return rdmult > 0 ? (int)AOMMIN(rdmult, INT_MAX) : 1;
}